

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

char * mg_md5(char *buf,...)

{
  byte bVar1;
  char in_AL;
  uint uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar5;
  uint uVar6;
  undefined8 in_RSI;
  void *pvVar7;
  long lVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  uint uVar9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar hash [16];
  MD5_CTX ctx;
  undefined8 *local_198;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined4 local_98;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Da;
    local_98 = in_XMM2_Da;
    local_88 = in_XMM3_Da;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_148 = 0xefcdab8967452301;
  uStack_140 = 0x1032547698badcfe;
  local_138 = 0;
  local_198 = (undefined8 *)&stack0x00000008;
  uVar5 = 8;
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
LAB_001070f8:
  if (uVar5 < 0x29) {
    uVar4 = (ulong)uVar5;
    uVar5 = uVar5 + 8;
    puVar3 = (undefined8 *)((long)local_e8 + uVar4);
  }
  else {
    puVar3 = local_198;
    local_198 = local_198 + 1;
  }
  __s = (char *)*puVar3;
  if (__s == (char *)0x0) {
    uVar5 = (uint)local_138 >> 3 & 0x3f;
    pvVar7 = (void *)((long)&uStack_130 + (ulong)uVar5 + 1);
    *(undefined1 *)((long)&uStack_130 + (ulong)uVar5) = 0x80;
    if ((uVar5 ^ 0x3f) < 8) {
      memset(pvVar7,0,(ulong)(uVar5 ^ 0x3f));
      MD5Transform((uint32_t *)&local_148,(uint32_t *)&uStack_130);
      local_110 = 0;
      uStack_108 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      local_100 = 0;
    }
    else {
      memset(pvVar7,0,(ulong)(0x37 - uVar5));
    }
    uStack_f8 = local_138;
    MD5Transform((uint32_t *)&local_148,(uint32_t *)&uStack_130);
    local_158 = local_148;
    uStack_150 = uStack_140;
    lVar8 = 0;
    do {
      bVar1 = *(byte *)((long)&local_158 + lVar8);
      buf[lVar8 * 2] = "0123456789abcdef"[bVar1 >> 4];
      buf[lVar8 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    buf[0x20] = '\0';
    return buf;
  }
  uVar4 = strlen(__s);
  uVar2 = (uint)local_138;
  uVar9 = (uint)uVar4;
  if (CARRY4(uVar9 * 8,(uint)local_138)) {
    local_138._4_4_ = local_138._4_4_ + 1;
  }
  local_138 = CONCAT44(local_138._4_4_ + ((uint)(uVar4 >> 0x1d) & 7),uVar9 * 8 + (uint)local_138);
  uVar2 = uVar2 >> 3 & 0x3f;
  if (uVar2 != 0) goto code_r0x00107165;
  goto LAB_001071be;
code_r0x00107165:
  pvVar7 = (void *)((long)&uStack_130 + (ulong)uVar2);
  uVar2 = 0x40 - uVar2;
  uVar6 = uVar9 - uVar2;
  if (uVar9 < uVar2) {
    memcpy(pvVar7,__s,uVar4 & 0xffffffff);
    uVar6 = uVar9;
  }
  else {
    memcpy(pvVar7,__s,(ulong)uVar2);
    MD5Transform((uint32_t *)&local_148,(uint32_t *)&uStack_130);
    __s = __s + uVar2;
  }
  uVar4 = (ulong)uVar6;
  if (uVar2 <= uVar9) {
LAB_001071be:
    uVar9 = (uint)uVar4;
    while (0x3f < uVar9) {
      uStack_130 = *(undefined8 *)__s;
      uStack_128 = *(undefined8 *)(__s + 8);
      uStack_120 = *(undefined8 *)(__s + 0x10);
      uStack_118 = *(undefined8 *)(__s + 0x18);
      local_110 = *(undefined8 *)(__s + 0x20);
      uStack_108 = *(undefined8 *)(__s + 0x28);
      local_100 = *(undefined8 *)(__s + 0x30);
      uStack_f8 = *(undefined8 *)(__s + 0x38);
      MD5Transform((uint32_t *)&local_148,(uint32_t *)&uStack_130);
      __s = __s + 0x40;
      uVar9 = (int)uVar4 - 0x40;
      uVar4 = (ulong)uVar9;
    }
    memcpy(&uStack_130,__s,uVar4 & 0xffffffff);
  }
  goto LAB_001070f8;
}

Assistant:

char *mg_md5(char buf[33], ...) {
  unsigned char hash[16];
  const char *p;
  va_list ap;
  MD5_CTX ctx;

  MD5Init(&ctx);

  va_start(ap, buf);
  while ((p = va_arg(ap, const char *)) != NULL) {
    MD5Update(&ctx, (const unsigned char *) p, (unsigned) strlen(p));
  }
  va_end(ap);

  MD5Final(hash, &ctx);
  bin2str(buf, hash, sizeof(hash));
  return buf;
}